

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

bool cmdline::detail::
     lexical_cast_t<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
     ::cast(string *arg)

{
  bool bVar1;
  byte bVar2;
  long *plVar3;
  bad_cast *this;
  istringstream local_198 [8];
  istringstream ss;
  bool local_11;
  string *psStack_10;
  bool ret;
  string *arg_local;
  
  psStack_10 = arg;
  std::__cxx11::istringstream::istringstream(local_198,(string *)arg,_S_in);
  plVar3 = (long *)std::istream::operator>>(local_198,&local_11);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar1) && (bVar2 = std::ios::eof(), (bVar2 & 1) != 0)) {
    std::__cxx11::istringstream::~istringstream(local_198);
    return (bool)(local_11 & 1);
  }
  this = (bad_cast *)__cxa_allocate_exception(8);
  std::bad_cast::bad_cast(this);
  __cxa_throw(this,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static Target cast(const std::string &arg)
			{
				Target ret;
				std::istringstream ss(arg);
				if(!(ss >> ret && ss.eof()))
					throw std::bad_cast();
				return ret;
			}